

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressStream_generic
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective flushMode)

{
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  char *dst;
  ulong uVar11;
  char *dst_00;
  ulong uVar12;
  void *local_60;
  
  pvVar2 = input->src;
  pvVar7 = (void *)(input->size + (long)pvVar2);
  pvVar3 = output->dst;
  sVar6 = output->size;
  dst = (char *)(output->pos + (long)pvVar3);
  bVar4 = false;
  local_60 = (void *)(input->pos + (long)pvVar2);
LAB_00377038:
  while( true ) {
    if (bVar4) {
      input->pos = (long)local_60 - (long)pvVar2;
      output->pos = (long)dst - (long)pvVar3;
      if (zcs->frameEnded != 0) {
        return 0;
      }
      sVar6 = zcs->inBuffTarget - zcs->inBuffPos;
      if (sVar6 != 0) {
        return sVar6;
      }
      return zcs->blockSize;
    }
    ZVar1 = zcs->streamStage;
    if (ZVar1 == zcss_load) break;
    if (ZVar1 == zcss_flush) {
      uVar11 = zcs->outBuffContentSize;
      sVar5 = zcs->outBuffFlushedSize;
      uVar9 = (long)pvVar3 + (sVar6 - (long)dst);
LAB_0037728f:
      uVar11 = uVar11 - sVar5;
      uVar12 = uVar11;
      if (uVar9 < uVar11) {
        uVar12 = uVar9;
      }
      if (uVar12 != 0) {
        memcpy(dst,zcs->outBuff + sVar5,uVar12);
        sVar5 = zcs->outBuffFlushedSize;
      }
      dst = dst + uVar12;
      zcs->outBuffFlushedSize = sVar5 + uVar12;
      bVar4 = true;
      if (uVar11 <= uVar9) {
        zcs->outBuffContentSize = 0;
        zcs->outBuffFlushedSize = 0;
        if (zcs->frameEnded == 0) {
          zcs->streamStage = zcss_load;
          bVar4 = false;
        }
        else {
          zcs->streamStage = zcss_init;
          zcs->pledgedSrcSizePlusOne = 0;
        }
      }
    }
    else {
      bVar4 = false;
      if (ZVar1 == zcss_init) {
        return 0xffffffffffffffc2;
      }
    }
  }
  if (flushMode == ZSTD_e_end) {
    sVar8 = (long)pvVar3 + (sVar6 - (long)dst);
    uVar9 = (long)pvVar7 - (long)local_60;
    uVar11 = (ulong)(0x20000U - (int)uVar9 >> 0xb);
    if (0x1ffff < uVar9) {
      uVar11 = 0;
    }
    sVar5 = zcs->inBuffPos;
    if (sVar5 != 0 || sVar8 < uVar11 + (uVar9 >> 8) + uVar9) goto LAB_00377121;
    sVar5 = ZSTD_compressEnd(zcs,dst,sVar8,local_60,uVar9);
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    zcs->streamStage = zcss_init;
    zcs->frameEnded = 1;
    zcs->pledgedSrcSizePlusOne = 0;
    dst = dst + sVar5;
  }
  else {
    sVar5 = zcs->inBuffPos;
    uVar9 = (long)pvVar7 - (long)local_60;
LAB_00377121:
    uVar11 = zcs->inBuffTarget - sVar5;
    if (uVar9 <= uVar11) {
      uVar11 = uVar9;
    }
    if (uVar11 != 0) {
      memcpy(zcs->inBuff + sVar5,local_60,uVar11);
      sVar5 = zcs->inBuffPos;
    }
    uVar9 = sVar5 + uVar11;
    zcs->inBuffPos = uVar9;
    local_60 = (void *)((long)local_60 + uVar11);
    if (flushMode == ZSTD_e_flush) {
      bVar4 = true;
      if (uVar9 == zcs->inToCompress) goto LAB_00377038;
    }
    else if ((flushMode == ZSTD_e_continue) && (bVar4 = true, uVar9 < zcs->inBuffTarget))
    goto LAB_00377038;
    sVar5 = uVar9 - zcs->inToCompress;
    uVar9 = (long)pvVar3 + (sVar6 - (long)dst);
    uVar11 = (ulong)(0x20000U - (int)sVar5 >> 0xb);
    if (0x1ffff < sVar5) {
      uVar11 = 0;
    }
    sVar8 = uVar9;
    dst_00 = dst;
    if (uVar9 < uVar11 + (sVar5 >> 8) + sVar5) {
      dst_00 = zcs->outBuff;
      sVar8 = zcs->outBuffSize;
    }
    if (flushMode == ZSTD_e_end && local_60 == pvVar7) {
      uVar11 = ZSTD_compressEnd(zcs,dst_00,sVar8,zcs->inBuff + zcs->inToCompress,sVar5);
    }
    else {
      uVar11 = ZSTD_compressContinue(zcs,dst_00,sVar8,zcs->inBuff + zcs->inToCompress,sVar5);
    }
    if (0xffffffffffffff88 < uVar11) {
      return uVar11;
    }
    uVar10 = (uint)(flushMode == ZSTD_e_end && local_60 == pvVar7);
    zcs->frameEnded = uVar10;
    sVar5 = zcs->inBuffPos;
    uVar12 = zcs->blockSize + sVar5;
    zcs->inBuffTarget = uVar12;
    if (zcs->inBuffSize < uVar12) {
      zcs->inBuffPos = 0;
      zcs->inBuffTarget = zcs->blockSize;
      sVar5 = 0;
    }
    zcs->inToCompress = sVar5;
    if (dst_00 != dst) {
      zcs->outBuffContentSize = uVar11;
      zcs->outBuffFlushedSize = 0;
      zcs->streamStage = zcss_flush;
      sVar5 = 0;
      goto LAB_0037728f;
    }
    dst = dst + uVar11;
    bVar4 = false;
    if (uVar10 == 0) goto LAB_00377038;
    zcs->streamStage = zcss_init;
    zcs->pledgedSrcSizePlusOne = 0;
  }
  bVar4 = true;
  local_60 = pvVar7;
  goto LAB_00377038;
}

Assistant:

size_t ZSTD_compressStream_generic(ZSTD_CStream* zcs,
                                   ZSTD_outBuffer* output,
                                   ZSTD_inBuffer* input,
                                   ZSTD_EndDirective const flushMode)
{
    const char* const istart = (const char*)input->src;
    const char* const iend = istart + input->size;
    const char* ip = istart + input->pos;
    char* const ostart = (char*)output->dst;
    char* const oend = ostart + output->size;
    char* op = ostart + output->pos;
    U32 someMoreWork = 1;

    /* check expectations */
    DEBUGLOG(5, "ZSTD_compressStream_generic, flush=%u", (unsigned)flushMode);
    assert(zcs->inBuff != NULL);
    assert(zcs->inBuffSize > 0);
    assert(zcs->outBuff !=  NULL);
    assert(zcs->outBuffSize > 0);
    assert(output->pos <= output->size);
    assert(input->pos <= input->size);

    while (someMoreWork) {
        switch(zcs->streamStage)
        {
        case zcss_init:
            /* call ZSTD_initCStream() first ! */
            return ERROR(init_missing);

        case zcss_load:
            if ( (flushMode == ZSTD_e_end)
              && ((size_t)(oend-op) >= ZSTD_compressBound(iend-ip))  /* enough dstCapacity */
              && (zcs->inBuffPos == 0) ) {
                /* shortcut to compression pass directly into output buffer */
                size_t const cSize = ZSTD_compressEnd(zcs,
                                                op, oend-op, ip, iend-ip);
                DEBUGLOG(4, "ZSTD_compressEnd : cSize=%u", (unsigned)cSize);
                if (ZSTD_isError(cSize)) return cSize;
                ip = iend;
                op += cSize;
                zcs->frameEnded = 1;
                ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                someMoreWork = 0; break;
            }
            /* complete loading into inBuffer */
            {   size_t const toLoad = zcs->inBuffTarget - zcs->inBuffPos;
                size_t const loaded = ZSTD_limitCopy(
                                        zcs->inBuff + zcs->inBuffPos, toLoad,
                                        ip, iend-ip);
                zcs->inBuffPos += loaded;
                ip += loaded;
                if ( (flushMode == ZSTD_e_continue)
                  && (zcs->inBuffPos < zcs->inBuffTarget) ) {
                    /* not enough input to fill full block : stop here */
                    someMoreWork = 0; break;
                }
                if ( (flushMode == ZSTD_e_flush)
                  && (zcs->inBuffPos == zcs->inToCompress) ) {
                    /* empty */
                    someMoreWork = 0; break;
                }
            }
            /* compress current block (note : this stage cannot be stopped in the middle) */
            DEBUGLOG(5, "stream compression stage (flushMode==%u)", flushMode);
            {   void* cDst;
                size_t cSize;
                size_t const iSize = zcs->inBuffPos - zcs->inToCompress;
                size_t oSize = oend-op;
                unsigned const lastBlock = (flushMode == ZSTD_e_end) && (ip==iend);
                if (oSize >= ZSTD_compressBound(iSize))
                    cDst = op;   /* compress into output buffer, to skip flush stage */
                else
                    cDst = zcs->outBuff, oSize = zcs->outBuffSize;
                cSize = lastBlock ?
                        ZSTD_compressEnd(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize) :
                        ZSTD_compressContinue(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize);
                if (ZSTD_isError(cSize)) return cSize;
                zcs->frameEnded = lastBlock;
                /* prepare next block */
                zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
                if (zcs->inBuffTarget > zcs->inBuffSize)
                    zcs->inBuffPos = 0, zcs->inBuffTarget = zcs->blockSize;
                DEBUGLOG(5, "inBuffTarget:%u / inBuffSize:%u",
                         (unsigned)zcs->inBuffTarget, (unsigned)zcs->inBuffSize);
                if (!lastBlock)
                    assert(zcs->inBuffTarget <= zcs->inBuffSize);
                zcs->inToCompress = zcs->inBuffPos;
                if (cDst == op) {  /* no need to flush */
                    op += cSize;
                    if (zcs->frameEnded) {
                        DEBUGLOG(5, "Frame completed directly in outBuffer");
                        someMoreWork = 0;
                        ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    }
                    break;
                }
                zcs->outBuffContentSize = cSize;
                zcs->outBuffFlushedSize = 0;
                zcs->streamStage = zcss_flush; /* pass-through to flush stage */
            }
	    /* fall-through */
        case zcss_flush:
            DEBUGLOG(5, "flush stage");
            {   size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
                size_t const flushed = ZSTD_limitCopy(op, oend-op,
                            zcs->outBuff + zcs->outBuffFlushedSize, toFlush);
                DEBUGLOG(5, "toFlush: %u into %u ==> flushed: %u",
                            (unsigned)toFlush, (unsigned)(oend-op), (unsigned)flushed);
                op += flushed;
                zcs->outBuffFlushedSize += flushed;
                if (toFlush!=flushed) {
                    /* flush not fully completed, presumably because dst is too small */
                    assert(op==oend);
                    someMoreWork = 0;
                    break;
                }
                zcs->outBuffContentSize = zcs->outBuffFlushedSize = 0;
                if (zcs->frameEnded) {
                    DEBUGLOG(5, "Frame completed on flush");
                    someMoreWork = 0;
                    ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    break;
                }
                zcs->streamStage = zcss_load;
                break;
            }

        default: /* impossible */
            assert(0);
        }
    }

    input->pos = ip - istart;
    output->pos = op - ostart;
    if (zcs->frameEnded) return 0;
    return ZSTD_nextInputSizeHint(zcs);
}